

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O3

void generate<trng::mt19937>(size_t samples,unsigned_long seed)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  uint uVar4;
  size_t sVar6;
  mt19937 r;
  char local_9f9;
  mt19937 local_9f8;
  uint uVar5;
  
  trng::mt19937::mt19937(&local_9f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::mt19937::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3500d0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"count: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"numbit: ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_9f9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_9f9,1);
  if (samples != 0) {
    sVar6 = 0;
    do {
      if (0x26f < local_9f8.S.mti) {
        lVar3 = 0;
        uVar5 = local_9f8.S.mt[0];
        do {
          uVar4 = uVar5 & 0x80000000;
          uVar5 = local_9f8.S.mt[lVar3 + 1];
          local_9f8.S.mt[lVar3] =
               *(uint *)(&DAT_00109b34 + (ulong)(uVar5 & 1) * 4) ^ local_9f8.S.mt[lVar3 + 0x18d] ^
               (uVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe3);
        lVar3 = 0;
        uVar5 = local_9f8.S.mt[0xe3];
        do {
          uVar4 = uVar5 & 0x80000000;
          uVar5 = local_9f8.S.mt[lVar3 + 0xe4];
          local_9f8.S.mt[lVar3 + 0xe3] =
               *(uint *)(&DAT_00109b34 + (ulong)(uVar5 & 1) * 4) ^ local_9f8.S.mt[lVar3] ^
               (uVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x18c);
        local_9f8.S.mt[0x26f] =
             *(uint *)(&DAT_00109b34 + (ulong)(local_9f8.S.mt[0] & 1) * 4) ^ local_9f8.S.mt[0x18c] ^
             (local_9f8.S.mt[0] & 0x7ffffffe | local_9f8.S.mt[0x26f] & 0x80000000) >> 1;
        local_9f8.S.mti = 0;
      }
      local_9f8.S.mti = local_9f8.S.mti + 1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_9f9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_9f9,1);
      sVar6 = sVar6 + 1;
    } while (sVar6 != samples);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}